

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::unpalettize(Image *this,bool forceAlpha)

{
  uint8 *puVar1;
  bool32 bVar2;
  int iVar3;
  uint8 *pixels;
  void *__ptr;
  bool bVar4;
  uint local_60;
  int local_50;
  int local_4c;
  int32 x;
  int32 y;
  uint8 *np;
  uint8 *p;
  uint8 *nline;
  uint8 *line;
  uint8 *npixels;
  int32 nstride;
  int32 ndepth;
  bool forceAlpha_local;
  Image *this_local;
  
  if (this->depth < 9) {
    bVar4 = true;
    if (!forceAlpha) {
      bVar2 = hasAlpha(this);
      bVar4 = bVar2 != 0;
    }
    local_60 = 0x18;
    if (bVar4) {
      local_60 = 0x20;
    }
    iVar3 = (int)(this->width * local_60) / 8;
    __ptr = (void *)0x30018;
    pixels = (uint8 *)mustmalloc_LOC((long)(iVar3 * this->height),0x30018,
                                     "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 714"
                                    );
    nline = this->pixels;
    p = pixels;
    for (local_4c = 0; local_4c < this->height; local_4c = local_4c + 1) {
      np = nline;
      _x = p;
      for (local_50 = 0; local_50 < this->width; local_50 = local_50 + 1) {
        *_x = this->palette[(int)((uint)*np << 2)];
        _x[1] = this->palette[(int)((uint)*np * 4 + 1)];
        _x[2] = this->palette[(int)((uint)*np * 4 + 2)];
        puVar1 = _x + 3;
        if (local_60 == 0x20) {
          _x[3] = this->palette[(int)((uint)*np * 4 + 3)];
          puVar1 = _x + 4;
        }
        _x = puVar1;
        np = np + 1;
      }
      nline = nline + this->stride;
      p = p + iVar3;
    }
    free(this,__ptr);
    this->depth = local_60;
    if (local_60 < 8) {
      local_60 = 1;
    }
    else {
      local_60 = local_60 / 8;
    }
    this->bpp = local_60;
    this->stride = iVar3;
    setPixels(this,pixels);
  }
  return;
}

Assistant:

void
Image::unpalettize(bool forceAlpha)
{
	if(this->depth > 8)
		return;
	assert(this->pixels);
	assert(this->palette);

	int32 ndepth = (forceAlpha || this->hasAlpha()) ? 32 : 24;
	int32 nstride = this->width*ndepth/8;
	uint8 *npixels = rwNewT(uint8, nstride*this->height, MEMDUR_EVENT | ID_IMAGE);

	uint8 *line = this->pixels;
	uint8 *nline = npixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			np[0] = this->palette[*p*4+0];
			np[1] = this->palette[*p*4+1];
			np[2] = this->palette[*p*4+2];
			np += 3;
			if(ndepth == 32)
				*np++ = this->palette[*p*4+3];
			p++;
		}
		line += this->stride;
		nline += nstride;
	}
	this->free();
	this->depth = ndepth;
	this->bpp = ndepth < 8 ? 1 : ndepth/8;
	this->stride = nstride;
	this->setPixels(npixels);
}